

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

bool __thiscall Thread::start(Thread *this,_func_uint_void_ptr *proc,void *param)

{
  int iVar1;
  pthread_t thread;
  void *local_10;
  
  if (this->thread != (void *)0x0) {
    return false;
  }
  iVar1 = pthread_create((pthread_t *)&local_10,(pthread_attr_t *)0x0,(__start_routine *)proc,param)
  ;
  if (iVar1 == 0) {
    this->thread = local_10;
  }
  return iVar1 == 0;
}

Assistant:

bool Thread::start(uint (*proc)(void*), void* param)
{
  if(thread)
    return false;
#ifdef _WIN32
  //DWORD threadId;
  ASSERT(sizeof(unsigned long) == sizeof(uint));

#ifndef __CYGWIN__
  thread = (void*)CreateThread(0, 0, (unsigned long (__stdcall*)(void*)) proc, param, 0, /*&threadId*/0);
  if(!thread)
    return false;
#else
  struct ThreadData
  {
    static DWORD WINAPI ThreadProc(LPVOID lpParameter)
    {
      ThreadData& data = *(ThreadData*)lpParameter;
      uint (*proc)(void*) = data.proc;
      void* param = data.param;
      VERIFY(SetEvent(data.hevent));
      // return proc(param); // this does not set the exit code
      ExitThread(proc(param));
    }
    uint (*proc)(void*);
    void* param;
    HANDLE hevent;
  } data;
  
  data.proc = proc;
  data.param = param;
  data.hevent = CreateEvent(NULL, FALSE, FALSE, NULL);
  if(data.hevent == NULL)
    return false;
  thread = (void*)CreateThread(0, 0, ThreadData::ThreadProc, &data, 0, /*&threadId*/0);
  if(!thread)
  {
    VERIFY(CloseHandle(data.hevent));
    return false;
  }
  VERIFY(WaitForSingleObject(data.hevent, INFINITE) == WAIT_OBJECT_0);
  VERIFY(CloseHandle(data.hevent));
#endif
  //this->threadId = threadId;
  return true;
#else
  pthread_t thread;
  if(pthread_create(&thread, 0, (void* (*) (void *)) proc, param) != 0)
    return false;
  this->thread = (void*)thread;
  return true;
#endif
}